

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

void __thiscall
cmFindPackageCommand::LoadPackageRegistryDir
          (cmFindPackageCommand *this,string *dir,cmSearchPath *outPaths)

{
  ulong uVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  unsigned_long uVar4;
  char *pcVar5;
  undefined1 local_320 [8];
  string fentry;
  ifstream fin;
  cmFindPackageCommandHoldFile local_f8;
  cmFindPackageCommandHoldFile holdFile;
  cmAlphaNum local_e8;
  cmAlphaNum local_b8;
  string local_88;
  ulong local_68;
  unsigned_long i;
  string fname;
  Status local_30;
  Directory local_28;
  Directory files;
  cmSearchPath *outPaths_local;
  string *dir_local;
  cmFindPackageCommand *this_local;
  
  files.Internal = (DirectoryInternals *)outPaths;
  cmsys::Directory::Directory(&local_28);
  local_30 = cmsys::Directory::Load(&local_28,dir,(string *)0x0);
  bVar2 = cmsys::Status::operator_cast_to_bool(&local_30);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    std::__cxx11::string::string((string *)&i);
    for (local_68 = 0; uVar1 = local_68, uVar4 = cmsys::Directory::GetNumberOfFiles(&local_28),
        uVar1 < uVar4; local_68 = local_68 + 1) {
      cmAlphaNum::cmAlphaNum(&local_b8,dir);
      cmAlphaNum::cmAlphaNum(&local_e8,'/');
      holdFile.File = cmsys::Directory::GetFile(&local_28,local_68);
      cmStrCat<char_const*>(&local_88,&local_b8,&local_e8,&holdFile.File);
      std::__cxx11::string::operator=((string *)&i,(string *)&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      bVar2 = cmsys::SystemTools::FileIsDirectory((string *)&i);
      if (!bVar2) {
        pcVar5 = (char *)std::__cxx11::string::c_str();
        anon_unknown.dwarf_516e9f::cmFindPackageCommandHoldFile::cmFindPackageCommandHoldFile
                  (&local_f8,pcVar5);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        _Var3 = std::operator|(_S_in,_S_bin);
        std::ifstream::ifstream((void *)((long)&fentry.field_2 + 8),pcVar5,_Var3);
        std::__cxx11::string::string((string *)local_320);
        bVar2 = std::ios::operator_cast_to_bool
                          ((ios *)((long)&fentry.field_2 +
                                  *(long *)(fentry.field_2._8_8_ + -0x18) + 8));
        if (((bVar2) &&
            (bVar2 = cmsys::SystemTools::GetLineFromStream
                               ((istream *)(fentry.field_2._M_local_buf + 8),(string *)local_320,
                                (bool *)0x0,0xffffffffffffffff), bVar2)) &&
           (bVar2 = CheckPackageRegistryEntry
                              (this,(string *)local_320,(cmSearchPath *)files.Internal), bVar2)) {
          anon_unknown.dwarf_516e9f::cmFindPackageCommandHoldFile::Release(&local_f8);
        }
        std::__cxx11::string::~string((string *)local_320);
        std::ifstream::~ifstream((void *)((long)&fentry.field_2 + 8));
        anon_unknown.dwarf_516e9f::cmFindPackageCommandHoldFile::~cmFindPackageCommandHoldFile
                  (&local_f8);
      }
    }
    std::__cxx11::string::~string((string *)&i);
    fname.field_2._8_4_ = 0;
  }
  else {
    fname.field_2._8_4_ = 1;
  }
  cmsys::Directory::~Directory(&local_28);
  return;
}

Assistant:

void cmFindPackageCommand::LoadPackageRegistryDir(std::string const& dir,
                                                  cmSearchPath& outPaths)
{
  cmsys::Directory files;
  if (!files.Load(dir)) {
    return;
  }

  std::string fname;
  for (unsigned long i = 0; i < files.GetNumberOfFiles(); ++i) {
    fname = cmStrCat(dir, '/', files.GetFile(i));

    if (!cmSystemTools::FileIsDirectory(fname)) {
      // Hold this file hostage until it behaves.
      cmFindPackageCommandHoldFile holdFile(fname.c_str());

      // Load the file.
      cmsys::ifstream fin(fname.c_str(), std::ios::in | std::ios::binary);
      std::string fentry;
      if (fin && cmSystemTools::GetLineFromStream(fin, fentry) &&
          this->CheckPackageRegistryEntry(fentry, outPaths)) {
        // The file references an existing package, so release it.
        holdFile.Release();
      }
    }
  }

  // TODO: Wipe out the directory if it is empty.
}